

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseTracking::SectionTracker::SectionTracker
          (SectionTracker *this,NameAndLocation *nameAndLocation,TrackerContext *ctx,
          ITracker *parent)

{
  int iVar1;
  undefined4 extraout_var;
  SectionTracker *parentSection;
  ITracker *local_28;
  ITracker *parent_local;
  TrackerContext *ctx_local;
  NameAndLocation *nameAndLocation_local;
  SectionTracker *this_local;
  
  TrackerBase::TrackerBase(&this->super_TrackerBase,nameAndLocation,ctx,parent);
  (this->super_TrackerBase).super_ITracker._vptr_ITracker =
       (_func_int **)&PTR__SectionTracker_0028b190;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_filters);
  trim(&this->m_trimmed_name,&nameAndLocation->name);
  local_28 = parent;
  if (parent != (ITracker *)0x0) {
    while (iVar1 = (*local_28->_vptr_ITracker[0xe])(), (((byte)iVar1 ^ 0xff) & 1) != 0) {
      iVar1 = (*local_28->_vptr_ITracker[7])();
      local_28 = (ITracker *)CONCAT44(extraout_var,iVar1);
    }
    addNextFilters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_28[1].m_nameAndLocation.location.line);
  }
  return;
}

Assistant:

SectionTracker::SectionTracker( NameAndLocation const& nameAndLocation, TrackerContext& ctx, ITracker* parent )
    :   TrackerBase( nameAndLocation, ctx, parent ),
        m_trimmed_name(trim(nameAndLocation.name))
    {
        if( parent ) {
            while( !parent->isSectionTracker() )
                parent = &parent->parent();

            SectionTracker& parentSection = static_cast<SectionTracker&>( *parent );
            addNextFilters( parentSection.m_filters );
        }
    }